

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcamera.h
# Opt level: O2

void CameraMoveToTarget(Camera *camera,float delta)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  uint uVar6;
  float fVar7;
  float fVar8;
  Vector3 VVar9;
  
  uVar2 = (camera->position).x;
  uVar4 = (camera->position).y;
  uVar3 = (camera->target).x;
  uVar5 = (camera->target).y;
  fVar1 = (camera->target).z;
  fVar7 = fVar1 - (camera->position).z;
  fVar7 = SQRT(fVar7 * fVar7 +
               ((float)uVar3 - (float)uVar2) * ((float)uVar3 - (float)uVar2) +
               ((float)uVar5 - (float)uVar4) * ((float)uVar5 - (float)uVar4)) + delta;
  VVar9 = GetCameraForward(camera);
  fVar8 = -fVar7;
  uVar6 = -(uint)(fVar8 < fVar7);
  fVar7 = (float)(~uVar6 & 0xba83126f | (uint)fVar8 & uVar6);
  (camera->position).x = fVar7 * VVar9.x + (float)uVar3;
  (camera->position).y = fVar7 * VVar9.y + (float)uVar5;
  (camera->position).z = fVar7 * VVar9.z + fVar1;
  return;
}

Assistant:

void CameraMoveToTarget(Camera *camera, float delta)
{
    float distance = Vector3Distance(camera->position, camera->target);

    // Apply delta
    distance += delta;

    // Distance must be greater than 0
    if (distance <= 0) distance = 0.001f;

    // Set new distance by moving the position along the forward vector
    Vector3 forward = GetCameraForward(camera);
    camera->position = Vector3Add(camera->target, Vector3Scale(forward, -distance));
}